

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall liblogger::LogFile::LogFile(LogFile *this,string *fname)

{
  char *pcVar1;
  ILogger message;
  ostream *poVar2;
  int *piVar3;
  undefined8 uVar4;
  string *in_RSI;
  LogException *in_RDI;
  stringstream ss;
  stringstream local_1a8 [16];
  ostream local_198 [392];
  string *local_10;
  
  local_10 = in_RSI;
  ILogger::ILogger((ILogger *)in_RDI);
  *(undefined ***)in_RDI = &PTR__LogFile_001cbfe8;
  std::__cxx11::string::string((string *)&in_RDI->m_message,local_10);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  message._vptr_ILogger = (_func_int **)fopen(pcVar1,"a");
  *(_func_int ***)(in_RDI + 1) = message._vptr_ILogger;
  if (*(_func_int ***)(in_RDI + 1) == (_func_int **)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"Cannot open file: \'");
    poVar2 = std::operator<<(poVar2,(string *)&in_RDI->m_message);
    poVar2 = std::operator<<(poVar2,"\' error: ");
    piVar3 = __errno_location();
    pcVar1 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar1);
    uVar4 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_RDI,(string *)message._vptr_ILogger);
    __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
  }
  return;
}

Assistant:

LogFile::LogFile(const std::string &fname) :
	m_fname(fname)
{
	m_fp = fopen(m_fname.c_str(), "a");
	if (m_fp == NULL)
	{
		std::stringstream ss;
		ss << "Cannot open file: '" << m_fname << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}
}